

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O3

void * AllocUnitsRare(CPpmd7 *p,uint indx)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar8;
  CPpmd_Void_Ref CVar9;
  Byte *pBVar10;
  uint uVar11;
  Byte *pBVar12;
  ulong uVar13;
  ulong uVar14;
  CPpmd_Void_Ref *pCVar15;
  ulong uVar7;
  
  uVar3 = (ulong)indx;
  uVar7 = uVar3;
  if (p->GlueCount == 0) {
    uVar4 = p->Size + p->AlignOffset;
    p->GlueCount = 0xff;
    lVar8 = 0;
    uVar5 = uVar4;
    do {
      bVar1 = p->Indx2Units[lVar8];
      CVar9 = p->FreeList[lVar8];
      p->FreeList[lVar8] = 0;
      if (CVar9 != 0) {
        pBVar10 = p->Base;
        uVar11 = uVar5;
        do {
          uVar5 = CVar9;
          *(uint *)(pBVar10 + (ulong)uVar5 + 4) = uVar11;
          *(uint *)(pBVar10 + (ulong)uVar11 + 8) = uVar5;
          CVar9 = *(CPpmd_Void_Ref *)(pBVar10 + uVar5);
          (pBVar10 + uVar5)[0] = '\0';
          (pBVar10 + uVar5)[1] = '\0';
          *(ushort *)(pBVar10 + (ulong)uVar5 + 2) = (ushort)bVar1;
          uVar11 = uVar5;
        } while (CVar9 != 0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x26);
    pBVar10 = p->Base;
    (pBVar10 + uVar4)[0] = '\x01';
    (pBVar10 + uVar4)[1] = '\0';
    *(uint *)(pBVar10 + (ulong)uVar4 + 4) = uVar5;
    *(uint *)(pBVar10 + (ulong)uVar5 + 8) = uVar4;
    pBVar12 = p->LoUnit;
    if (pBVar12 != p->HiUnit) {
      pBVar12[0] = '\x01';
      pBVar12[1] = '\0';
    }
    if (uVar5 != uVar4) {
      do {
        uVar14 = (ulong)uVar5;
        uVar13 = (ulong)*(ushort *)(pBVar10 + uVar14 + 2);
        uVar5 = (uint)*(ushort *)(pBVar10 + uVar13 * 0xc + uVar14 + 2) +
                (uint)*(ushort *)(pBVar10 + uVar14 + 2);
        if (uVar5 < 0x10000 && *(short *)(pBVar10 + uVar13 * 0xc + uVar14) == 0) {
          pBVar12 = pBVar10 + uVar13 * 0xc + uVar14;
          do {
            uVar11 = *(uint *)(pBVar12 + 4);
            uVar2 = *(uint *)(pBVar12 + 8);
            *(uint *)(pBVar10 + (ulong)uVar2 + 4) = uVar11;
            *(uint *)(pBVar10 + (ulong)uVar11 + 8) = uVar2;
            *(short *)(pBVar10 + uVar14 + 2) = (short)uVar5;
            if (*(short *)(pBVar10 + (ulong)uVar5 * 0xc + uVar14) != 0) break;
            pBVar12 = pBVar10 + (ulong)uVar5 * 0xc + uVar14;
            uVar5 = uVar5 + *(ushort *)(pBVar12 + 2);
          } while (uVar5 < 0x10000);
        }
        uVar5 = *(uint *)(pBVar10 + uVar14 + 4);
      } while (uVar5 != uVar4);
      uVar5 = *(uint *)(pBVar10 + (ulong)uVar4 + 4);
      while (uVar5 != uVar4) {
        uVar14 = (ulong)uVar5;
        pCVar15 = (CPpmd_Void_Ref *)(pBVar10 + uVar14);
        uVar5 = *(uint *)(pBVar10 + uVar14 + 4);
        uVar11 = (uint)*(ushort *)(pBVar10 + uVar14 + 2);
        iVar6 = (int)pBVar10;
        if (0x80 < *(ushort *)(pBVar10 + uVar14 + 2)) {
          CVar9 = p->FreeList[0x25];
          do {
            *(CPpmd_Void_Ref *)(pBVar10 + uVar14) = CVar9;
            CVar9 = (int)pCVar15 - iVar6;
            p->FreeList[0x25] = (CPpmd_Void_Ref)uVar14;
            uVar11 = uVar11 - 0x80;
            pCVar15 = pCVar15 + 0x180;
            uVar14 = uVar14 + 0x600;
          } while (0x80 < uVar11);
          pCVar15 = (CPpmd_Void_Ref *)(pBVar10 + uVar14);
        }
        uVar14 = (ulong)p->Units2Indx[uVar11 - 1];
        if (uVar11 != p->Indx2Units[uVar14]) {
          uVar14 = (ulong)(p->Units2Indx[uVar11 - 1] - 1);
          bVar1 = p->Indx2Units[uVar14];
          uVar11 = uVar11 + ~(uint)bVar1;
          pCVar15[(ulong)bVar1 * 3] = p->FreeList[uVar11];
          p->FreeList[uVar11] = (int)(pCVar15 + (ulong)bVar1 * 3) - iVar6;
        }
        *pCVar15 = p->FreeList[uVar14];
        p->FreeList[uVar14] = (int)pCVar15 - iVar6;
      }
    }
    uVar14 = (ulong)p->FreeList[uVar3];
    if (uVar14 != 0) {
      p->FreeList[uVar3] = *(CPpmd_Void_Ref *)(pBVar10 + uVar14);
      return pBVar10 + uVar14;
    }
  }
  do {
    if ((int)uVar7 == 0x25) {
      bVar1 = p->Indx2Units[uVar3];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar10 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar10;
        return pBVar10;
      }
      return (void *)0x0;
    }
    uVar5 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar5;
    uVar14 = (ulong)p->FreeList[uVar7];
  } while (uVar14 == 0);
  pBVar10 = p->Base + uVar14;
  p->FreeList[uVar7] = *(CPpmd_Void_Ref *)(p->Base + uVar14);
  SplitBlock(p,pBVar10,uVar5,indx);
  return pBVar10;
}

Assistant:

static void *AllocUnitsRare(CPpmd7 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}